

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AntennaLocation.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::AntennaLocation::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AntennaLocation *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Antenna Location:\n");
  poVar1 = std::operator<<(poVar1,"\tWorld Location:       ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1c0,&this->m_AntennaLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tEntity Location:      ");
  Vector::GetAsString_abi_cxx11_(&local_1e0,&this->m_RelativeAntennaLocation);
  std::operator<<(poVar1,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString AntennaLocation::GetAsString() const
{
    KStringStream ss;

    ss << "Antenna Location:\n"
       << "\tWorld Location:       " << m_AntennaLocation.GetAsString()
       << "\tEntity Location:      " << m_RelativeAntennaLocation.GetAsString();

    return ss.str();
}